

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CGL::Application::update_style(Application *this)

{
  float fVar1;
  double dVar2;
  undefined1 auVar3 [16];
  
  auVar3 = vsubpd_avx(*(undefined1 (*) [16])&this->field_0xf0,
                      *(undefined1 (*) [16])&this->field_0x110);
  dVar2 = *(double *)&this->field_0x100 - *(double *)&this->field_0x120;
  auVar3 = vdppd_avx(auVar3,auVar3,0x31);
  dVar2 = dVar2 * dVar2 + auVar3._0_8_;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar2;
    auVar3 = vsqrtsd_avx(auVar3,auVar3);
    dVar2 = auVar3._0_8_;
  }
  fVar1 = (float)(this->canonical_view_distance / (double)(float)dVar2);
  (this->hoverStyle).strokeWidth = fVar1 + fVar1;
  (this->selectStyle).strokeWidth = fVar1 + fVar1;
  (this->hoverStyle).vertexRadius = fVar1 * 8.0;
  (this->selectStyle).vertexRadius = fVar1 * 8.0;
  return;
}

Assistant:

void Application::update_style() {

  float view_distance = (camera.position() - camera.view_point()).norm();
  float scale_factor = canonical_view_distance / view_distance;

    hoverStyle.strokeWidth = 2.0 * scale_factor;
   selectStyle.strokeWidth = 2.0 * scale_factor;

    hoverStyle.vertexRadius = 8.0 * scale_factor;
   selectStyle.vertexRadius = 8.0 * scale_factor;
}